

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::CopyHeadIfInlinedHeadSegment<int>
               (JavascriptArray *array,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  SparseArraySegmentBase **ppSVar3;
  undefined4 *puVar4;
  SparseArraySegmentBase *pSVar5;
  SparseArraySegmentBase *pSVar6;
  SparseArraySegment<int> *newHeadSeg;
  Recycler *recycler_local;
  JavascriptArray *array_local;
  
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&array->head);
  bVar2 = IsInlineSegment(*ppSVar3,array);
  if (bVar2) {
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&array->head);
    if (*ppSVar3 == (SparseArraySegmentBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1583,"(array->head)","array->head");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ppSVar3 = Memory::PointerValue<Js::SparseArraySegmentBase>(&array->head);
    pSVar6 = *ppSVar3;
    pSVar5 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&array->head);
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&pSVar5->next);
    pSVar6 = &ReallocNonLeafSegment<int>(array,(SparseArraySegment<int> *)pSVar6,*ppSVar3,false)->
              super_SparseArraySegmentBase;
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&array->head,pSVar6);
    InvalidateLastUsedSegment(array);
    ClearSegmentMap(array);
  }
  return;
}

Assistant:

void JavascriptArray::CopyHeadIfInlinedHeadSegment(JavascriptArray *array, Recycler *recycler)
    {
        if (JavascriptArray::IsInlineSegment(array->head, array))
        {
            AnalysisAssert(array->head);
            SparseArraySegment<T>* newHeadSeg = array->ReallocNonLeafSegment((SparseArraySegment<T>*)PointerValue(array->head), array->head->next);
            array->head = newHeadSeg;
            array->InvalidateLastUsedSegment();
            array->ClearSegmentMap();
        }
    }